

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sumInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  SumCtx *pSum;
  i64 iVar2;
  double dVar3;
  
  if ((short)context->pMem->flags < 0) {
    pSum = (SumCtx *)context->pMem->z;
  }
  else {
    pSum = (SumCtx *)createAggContext(context,0x28);
  }
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 != 5 && pSum != (SumCtx *)0x0) {
    pSum->cnt = pSum->cnt + -1;
    if (pSum->approx != '\0') {
      if (iVar1 == 1) {
        iVar2 = sqlite3VdbeIntValue(*argv);
        kahanBabuskaNeumaierStepInt64(pSum,-iVar2);
        return;
      }
      dVar3 = sqlite3VdbeRealValue(*argv);
      kahanBabuskaNeumaierStep(pSum,-dVar3);
      return;
    }
    iVar2 = sqlite3VdbeIntValue(*argv);
    pSum->iSum = pSum->iSum - iVar2;
  }
  return;
}

Assistant:

static void sumInverse(sqlite3_context *context, int argc, sqlite3_value**argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  /* p is always non-NULL because sumStep() will have been called first
  ** to initialize it */
  if( ALWAYS(p) && type!=SQLITE_NULL ){
    assert( p->cnt>0 );
    p->cnt--;
    if( !p->approx ){
      p->iSum -= sqlite3_value_int64(argv[0]);
    }else if( type==SQLITE_INTEGER ){
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal!=SMALLEST_INT64 ){
        kahanBabuskaNeumaierStepInt64(p, -iVal);
      }else{
        kahanBabuskaNeumaierStepInt64(p, LARGEST_INT64);
        kahanBabuskaNeumaierStepInt64(p, 1);
      }
    }else{
      kahanBabuskaNeumaierStep(p, -sqlite3_value_double(argv[0]));
    }
  }
}